

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_1x1_pack1to4_int8.h
# Opt level: O0

void ncnn::conv1x1s2_sgemm_pack1to4_int8_sse(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Option *opt)

{
  long in_RSI;
  long *in_RDI;
  int j;
  int i;
  char *outptr;
  char *r0;
  int p;
  Mat bottom_blob_shrinked;
  int tailstep;
  int outh;
  int outw;
  int elempack;
  size_t elemsize;
  int channels;
  int w;
  Mat *m_1;
  Mat *m;
  undefined8 in_stack_fffffffffffffcd0;
  size_t in_stack_fffffffffffffcd8;
  undefined8 in_stack_fffffffffffffce0;
  undefined8 in_stack_fffffffffffffce8;
  Mat *in_stack_fffffffffffffcf0;
  int local_2d8;
  int local_2d4;
  undefined8 local_2d0;
  Option *in_stack_fffffffffffffd38;
  Mat *in_stack_fffffffffffffd40;
  undefined4 uVar1;
  Mat *in_stack_fffffffffffffd48;
  Mat *in_stack_fffffffffffffd50;
  undefined1 *local_288;
  undefined8 local_280;
  undefined8 local_278;
  undefined8 local_270;
  undefined4 local_268;
  long local_260;
  undefined4 local_258;
  undefined4 local_254;
  undefined4 local_250;
  undefined4 local_24c;
  undefined4 local_248;
  undefined8 local_240;
  undefined1 *local_238;
  int local_230;
  void *local_220;
  int *local_218;
  long local_210;
  undefined4 local_208;
  Mat *local_200;
  undefined4 local_1f8;
  int local_1f4;
  int local_1f0;
  undefined4 local_1ec;
  undefined4 local_1e8;
  long local_1e0;
  int local_1d8;
  int local_1d4;
  int local_1d0;
  undefined4 local_1cc;
  long local_1c8;
  int local_1c0;
  int local_1bc;
  long *local_1a0;
  void **local_198;
  undefined8 *local_190;
  undefined8 *local_188;
  void **local_180;
  int local_160;
  undefined4 local_15c;
  void **local_158;
  undefined8 *local_148;
  undefined8 *local_138;
  undefined1 local_12d;
  int local_12c;
  void **local_128;
  undefined8 *local_120;
  undefined1 local_fd;
  int local_fc;
  undefined8 *local_f0;
  void *local_b0;
  long local_a0;
  undefined4 local_94;
  long local_90;
  undefined1 *local_88;
  undefined4 local_7c;
  int local_78;
  int local_74;
  undefined8 *local_70;
  Mat *local_68;
  undefined4 local_5c;
  long local_58;
  undefined1 *local_50;
  undefined4 local_44;
  int local_40;
  int local_3c;
  undefined8 *local_38;
  undefined4 local_2c;
  long local_28;
  undefined4 local_1c;
  long local_18;
  undefined8 *local_10;
  undefined8 *local_8;
  
  local_1bc = *(int *)((long)in_RDI + 0x2c);
  local_1c0 = (int)in_RDI[7];
  local_1c8 = in_RDI[2];
  local_1cc = (undefined4)in_RDI[3];
  local_1d0 = *(int *)(in_RSI + 0x2c);
  local_1d4 = *(int *)(in_RSI + 0x30);
  local_1d8 = local_1bc * 2 + local_1d0 * -2;
  local_198 = &local_220;
  local_220 = (void *)0x0;
  local_218 = (int *)0x0;
  local_210 = 0;
  local_208 = 0;
  local_200 = (Mat *)0x0;
  local_1f8 = 0;
  local_1f4 = 0;
  local_1f0 = 0;
  local_1ec = 0;
  local_1e8 = 0;
  local_1e0 = 0;
  local_1a0 = in_RDI;
  Mat::create(in_stack_fffffffffffffcf0,(int)((ulong)in_stack_fffffffffffffce8 >> 0x20),
              (int)in_stack_fffffffffffffce8,(int)((ulong)in_stack_fffffffffffffce0 >> 0x20),
              in_stack_fffffffffffffcd8,(int)((ulong)in_stack_fffffffffffffcd0 >> 0x20),
              (Allocator *)in_stack_fffffffffffffd50);
  for (local_230 = 0; local_230 < local_1c0; local_230 = local_230 + 1) {
    local_f0 = &local_280;
    local_74 = *(int *)((long)local_1a0 + 0x2c);
    local_78 = (int)local_1a0[6];
    local_7c = *(undefined4 *)((long)local_1a0 + 0x34);
    local_88 = (undefined1 *)(*local_1a0 + local_1a0[8] * (long)local_230 * local_1a0[2]);
    local_90 = local_1a0[2];
    local_94 = (undefined4)local_1a0[3];
    local_a0 = local_1a0[4];
    local_70 = &local_280;
    local_18 = (long)local_74 * (long)local_78 * local_90;
    local_8 = &local_280;
    local_190 = &local_280;
    local_120 = &local_2d0;
    local_128 = &local_220;
    local_50 = (undefined1 *)((long)local_220 + local_1e0 * local_230 * local_210);
    local_38 = &local_2d0;
    local_28 = (long)local_1f4 * (long)local_1f0 * local_210;
    local_10 = &local_2d0;
    local_188 = &local_2d0;
    local_248 = 0;
    local_24c = 0;
    local_250 = 0;
    local_254 = 0;
    local_268 = 0;
    local_270 = 0;
    local_278 = 0;
    local_280 = 0;
    local_1c = 0x10;
    local_2c = 0x10;
    local_3c = local_1f4;
    local_40 = local_1f0;
    local_44 = local_1ec;
    local_58 = local_210;
    local_5c = local_208;
    local_68 = local_200;
    local_fc = local_230;
    local_fd = 1;
    local_12c = local_230;
    local_12d = 1;
    local_240 = 0;
    local_258 = 0;
    local_2d0 = 0;
    in_stack_fffffffffffffd40 = (Mat *)0x0;
    uVar1 = 0;
    in_stack_fffffffffffffd38 = (Option *)0x0;
    local_288 = local_50;
    local_238 = local_88;
    for (local_2d4 = 0; local_2d4 < local_1d4; local_2d4 = local_2d4 + 1) {
      for (local_2d8 = 0; local_2d8 + 3 < local_1d0; local_2d8 = local_2d8 + 4) {
        *local_288 = *local_238;
        local_288[1] = local_238[2];
        local_288[2] = local_238[4];
        local_288[3] = local_238[6];
        local_238 = local_238 + 8;
        local_288 = local_288 + 4;
      }
      for (; local_2d8 + 1 < local_1d0; local_2d8 = local_2d8 + 2) {
        *local_288 = *local_238;
        local_288[1] = local_238[2];
        local_238 = local_238 + 4;
        local_288 = local_288 + 2;
      }
      for (; local_2d8 < local_1d0; local_2d8 = local_2d8 + 1) {
        *local_288 = *local_238;
        local_238 = local_238 + 2;
        local_288 = local_288 + 1;
      }
      local_238 = local_238 + local_1d8;
    }
    in_stack_fffffffffffffd50 = local_200;
    local_148 = local_188;
    local_138 = local_190;
    local_260 = local_a0;
  }
  conv1x1s1_sgemm_pack1to4_int8_sse
            (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
             in_stack_fffffffffffffd38);
  local_180 = &local_220;
  if (local_218 != (int *)0x0) {
    local_15c = 0xffffffff;
    LOCK();
    local_160 = *local_218;
    *local_218 = *local_218 + -1;
    UNLOCK();
    if (local_160 == 1) {
      local_158 = local_180;
      if (local_200 == (Mat *)0x0) {
        local_b0 = local_220;
        if (local_220 != (void *)0x0) {
          free(local_220);
        }
      }
      else {
        (**(code **)((long)local_200->data + 0x18))(local_200,local_220);
      }
    }
  }
  return;
}

Assistant:

static void conv1x1s2_sgemm_pack1to4_int8_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Option& opt)
{
    int w = bottom_blob.w;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int tailstep = w - 2 * outw + w;

    Mat bottom_blob_shrinked;
    bottom_blob_shrinked.create(outw, outh, channels, elemsize, elempack, opt.workspace_allocator);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < channels; p++)
    {
        const signed char* r0 = bottom_blob.channel(p);
        signed char* outptr = bottom_blob_shrinked.channel(p);

        for (int i = 0; i < outh; i++)
        {
            int j = 0;
            for (; j + 3 < outw; j += 4)
            {
                outptr[0] = r0[0];
                outptr[1] = r0[2];
                outptr[2] = r0[4];
                outptr[3] = r0[6];

                r0 += 8;
                outptr += 4;
            }
            for (; j + 1 < outw; j += 2)
            {
                outptr[0] = r0[0];
                outptr[1] = r0[2];

                r0 += 4;
                outptr += 2;
            }
            for (; j < outw; j++)
            {
                outptr[0] = r0[0];

                r0 += 2;
                outptr += 1;
            }

            r0 += tailstep;
        }
    }

    conv1x1s1_sgemm_pack1to4_int8_sse(bottom_blob_shrinked, top_blob, kernel, opt);
}